

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O0

void __thiscall
DSFrame::DSFrame(DSFrame *this,PVideoFrame *src,VideoInfo vi,IScriptEnvironment *env)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  uchar **ppuVar6;
  int *piVar7;
  VideoFrame *pVVar8;
  BYTE *pBVar9;
  int *local_70;
  int local_50;
  int i;
  DSFormat local_3c;
  IScriptEnvironment *local_20;
  IScriptEnvironment *env_local;
  PVideoFrame *src_local;
  DSFrame *this_local;
  
  this->FrameWidth = 0;
  this->FrameHeight = 0;
  this->SrcPointers = (uchar **)0x0;
  this->StrideBytes = (int *)0x0;
  this->DstPointers = (uchar **)0x0;
  local_20 = env;
  env_local = (IScriptEnvironment *)src;
  src_local = (PVideoFrame *)this;
  DSFormat::DSFormat(&this->Format);
  this->_vssrc = (VSFrameRef *)0x0;
  this->_vsdst = (VSFrameRef *)0x0;
  this->_vscore = (VSCore *)0x0;
  this->_vsapi = (VSAPI *)0x0;
  this->_vsformat = (VSFormat *)0x0;
  PVideoFrame::PVideoFrame(&this->_avssrc,(PVideoFrame *)env_local);
  memcpy(&this->_vi,&vi,0x30);
  this->_env = local_20;
  this->planes_y[0] = 1;
  this->planes_y[1] = 2;
  this->planes_y[2] = 4;
  this->planes_y[3] = 0x10;
  this->planes_r[0] = 0x20;
  this->planes_r[1] = 0x40;
  this->planes_r[2] = 0x80;
  this->planes_r[3] = 0x10;
  this->planes = (int *)0x0;
  pvVar4 = PVideoFrame::operator_cast_to_void_(&this->_avssrc);
  if (pvVar4 != (void *)0x0) {
    DSFormat::DSFormat(&local_3c,(this->_vi).pixel_type);
    (this->Format).IsFamilyYUV = local_3c.IsFamilyYUV;
    (this->Format).IsFamilyRGB = local_3c.IsFamilyRGB;
    (this->Format).IsFamilyYCC = local_3c.IsFamilyYCC;
    (this->Format).IsInteger = local_3c.IsInteger;
    (this->Format).IsFloat = local_3c.IsFloat;
    *(undefined3 *)&(this->Format).field_0x5 = local_3c._5_3_;
    (this->Format).SSW = local_3c.SSW;
    (this->Format).SSH = local_3c.SSH;
    (this->Format).BitsPerSample = local_3c.BitsPerSample;
    (this->Format).BytesPerSample = local_3c.BytesPerSample;
    (this->Format).Planes = local_3c.Planes;
    if (((this->Format).IsFamilyYUV & 1U) == 0) {
      local_70 = this->planes_r;
    }
    else {
      local_70 = this->planes_y;
    }
    this->planes = local_70;
    this->FrameWidth = (this->_vi).width;
    this->FrameHeight = (this->_vi).height;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->Format).Planes;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppuVar6 = (uchar **)operator_new__(uVar5);
    this->SrcPointers = ppuVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(this->Format).Planes;
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar7 = (int *)operator_new__(uVar5);
    this->StrideBytes = piVar7;
    for (local_50 = 0; local_50 < (this->Format).Planes; local_50 = local_50 + 1) {
      pVVar8 = PVideoFrame::operator->((PVideoFrame *)env_local);
      pBVar9 = VideoFrame::GetReadPtr(pVVar8,this->planes[local_50]);
      this->SrcPointers[local_50] = pBVar9;
      pVVar8 = PVideoFrame::operator->((PVideoFrame *)env_local);
      iVar3 = VideoFrame::GetPitch(pVVar8,this->planes[local_50]);
      this->StrideBytes[local_50] = iVar3;
    }
  }
  return;
}

Assistant:

DSFrame(PVideoFrame &src, VideoInfo vi, IScriptEnvironment * env)
    : _avssrc(src), _vi(vi), _env(env)
  {
    if (_avssrc) {
      Format = DSFormat(_vi.pixel_type);
      planes = Format.IsFamilyYUV ? planes_y : planes_r;
      FrameWidth = _vi.width;
      FrameHeight = _vi.height;

      SrcPointers = new const unsigned char*[Format.Planes];
      StrideBytes = new int[Format.Planes];
      for (int i = 0; i < Format.Planes; i++) {
        SrcPointers[i] = src->GetReadPtr(planes[i]);
        StrideBytes[i] = src->GetPitch(planes[i]);
      }
    }
  }